

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O0

int common_init(cubeb **ctx,char *ctx_name)

{
  int iVar1;
  int iVar2;
  char *__s1;
  char *__s2;
  char *ctx_backend;
  char *backend;
  char *in_stack_00000010;
  int r;
  cubeb *in_stack_ffffffffffffffd8;
  
  __s1 = getenv("CUBEB_BACKEND");
  iVar1 = cubeb_init((cubeb **)ctx_name,in_stack_00000010,backend);
  if ((iVar1 == 0) && (__s1 != (char *)0x0)) {
    __s2 = cubeb_get_backend_id(in_stack_ffffffffffffffd8);
    iVar2 = strcmp(__s1,__s2);
    if (iVar2 != 0) {
      fprintf(_stderr,"Requested backend `%s\', got `%s\'\n",__s1,__s2);
    }
  }
  return iVar1;
}

Assistant:

int common_init(cubeb ** ctx, char const * ctx_name)
{
#ifdef ENABLE_NORMAL_LOG
  if (cubeb_set_log_callback(CUBEB_LOG_NORMAL, print_log) != CUBEB_OK) {
    fprintf(stderr, "Set normal log callback failed\n");
  }
#endif

#ifdef ENABLE_VERBOSE_LOG
  if (cubeb_set_log_callback(CUBEB_LOG_VERBOSE, print_log) != CUBEB_OK) {
    fprintf(stderr, "Set verbose log callback failed\n");
  }
#endif

  int r;
  char const * backend;
  char const * ctx_backend;

  backend = getenv("CUBEB_BACKEND");
  r = cubeb_init(ctx, ctx_name, backend);
  if (r == CUBEB_OK && backend) {
    ctx_backend = cubeb_get_backend_id(*ctx);
    if (strcmp(backend, ctx_backend) != 0) {
      fprintf(stderr, "Requested backend `%s', got `%s'\n",
              backend, ctx_backend);
    }
  }

  return r;
}